

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void deqp::gls::BuiltinPrecisionTests::
     ContainerTraits<tcu::Matrix<float,_3,_4>,_tcu::Matrix<tcu::Interval,_3,_4>_>::doPrintIVal
               (FloatFormat *fmt,IVal *ival,ostream *os)

{
  long lVar1;
  int ndx;
  long lVar2;
  Vector<tcu::Interval,_3> *pVVar3;
  IVal *pIVar4;
  byte bVar5;
  undefined8 uStack_80;
  IVal local_78;
  
  bVar5 = 0;
  uStack_80 = 0x176b0cb;
  std::__ostream_insert<char,std::char_traits<char>>(os,"(",1);
  lVar2 = 0;
  do {
    if (lVar2 != 0) {
      uStack_80 = 0x176b0f3;
      std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
    }
    lVar1 = 8;
    do {
      *(undefined1 *)((long)local_78.m_data + lVar1 + -8) = 0;
      *(undefined4 *)(&local_78.m_data[0].m_hasNaN + lVar1) = 0;
      *(undefined4 *)(&local_78.m_data[0].field_0x4 + lVar1) = 0x7ff00000;
      *(undefined4 *)((long)&local_78.m_data[0].m_lo + lVar1) = 0;
      *(undefined4 *)((long)&local_78.m_data[0].m_lo + lVar1 + 4) = 0xfff00000;
      lVar1 = lVar1 + 0x18;
    } while (lVar1 != 0x50);
    pVVar3 = (ival->m_data).m_data + lVar2;
    pIVar4 = &local_78;
    for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
      *(undefined8 *)pIVar4 = *(undefined8 *)pVVar3->m_data;
      pVVar3 = (Vector<tcu::Interval,_3> *)((long)pVVar3 + ((ulong)bVar5 * -2 + 1) * 8);
      pIVar4 = (IVal *)((long)pIVar4 + ((ulong)bVar5 * -2 + 1) * 8);
    }
    uStack_80 = 0x176b13a;
    ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doPrintIVal
              (fmt,&local_78,os);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  uStack_80 = 0x176b15e;
  std::__ostream_insert<char,std::char_traits<char>>(os,")",1);
  return;
}

Assistant:

static void			doPrintIVal		(const FloatFormat& fmt, const IVal ival, ostream& os)
	{
		os << "(";

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
		{
			if (ndx > 0)
				os << ", ";

			printIVal<Element>(fmt, ival[ndx], os);
		}

		os << ")";
	}